

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  size_t _elemsize;
  void *pvVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  int iVar10;
  int k;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  size_type __n;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int i;
  int iVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  int local_268;
  void *local_250;
  int local_244;
  long local_220;
  int local_210;
  long local_200;
  void *local_1f0;
  Mat local_170;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_bordered;
  Option opt_pad;
  
  iVar30 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar20 = this->kernel_w;
  iVar25 = this->dilation_w;
  iVar21 = this->kernel_h;
  iVar18 = this->dilation_h;
  iVar3 = this->kernel_d;
  iVar22 = this->dilation_d;
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered._20_8_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  opt_pad.lightmode = opt->lightmode;
  opt_pad._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_pad.num_threads = opt->num_threads;
  opt_pad.blob_allocator = opt->blob_allocator;
  opt_pad.workspace_allocator = opt->workspace_allocator;
  opt_pad.openmp_blocktime = opt->openmp_blocktime;
  opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
  opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_pad.use_int8_inference = opt->use_int8_inference;
  opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
  uVar23._0_1_ = opt->use_bf16_storage;
  uVar23._1_1_ = opt->use_fp16_packed;
  uVar23._2_1_ = opt->use_fp16_storage;
  uVar23._3_1_ = opt->use_fp16_arithmetic;
  uVar23._4_1_ = opt->use_int8_packed;
  uVar23._5_1_ = opt->use_int8_storage;
  uVar23._6_1_ = opt->use_int8_arithmetic;
  uVar23._7_1_ = opt->use_packing_layout;
  opt_pad.use_shader_pack8 = opt->use_shader_pack8;
  opt_pad.use_subgroup_basic = opt->use_subgroup_basic;
  opt_pad.use_subgroup_vote = opt->use_subgroup_vote;
  opt_pad.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_pad.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_pad.use_image_storage = opt->use_image_storage;
  opt_pad.use_tensor_storage = opt->use_tensor_storage;
  opt_pad.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  opt_pad.flush_denormals = opt->flush_denormals;
  opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_pad.use_reserved_1 = opt->use_reserved_1;
  opt_pad.use_reserved_2 = opt->use_reserved_2;
  opt_pad.use_reserved_3 = opt->use_reserved_3;
  opt_pad.use_reserved_4 = opt->use_reserved_4;
  opt_pad.use_reserved_5 = opt->use_reserved_5;
  opt_pad.use_reserved_6 = opt->use_reserved_6;
  opt_pad.use_reserved_7 = opt->use_reserved_7;
  opt_pad.use_reserved_8 = opt->use_reserved_8;
  opt_pad.use_reserved_9 = opt->use_reserved_9;
  opt_pad.use_reserved_10 = opt->use_reserved_10;
  opt_pad.use_reserved_11 = opt->use_reserved_11;
  opt_pad._32_8_ = uVar23 & 0xffffffffffffff;
  make_padding(this,bottom_blob,&bottom_blob_bordered,&opt_pad);
  iVar10 = bottom_blob_bordered.h;
  iVar4 = bottom_blob_bordered.w;
  local_210 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    iVar7 = (~((iVar20 + -1) * iVar25) + bottom_blob_bordered.w) / this->stride_w;
    iVar8 = (~((iVar21 + -1) * iVar18) + bottom_blob_bordered.h) / this->stride_h;
    iVar3 = (~((iVar3 + -1) * iVar22) + bottom_blob_bordered.d) / this->stride_d;
    uVar11 = this->kernel_w * this->kernel_h * this->kernel_d;
    __n = (size_type)(int)uVar11;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
    iVar22 = iVar7 + 1;
    iVar20 = this->dilation_h;
    iVar25 = this->kernel_w;
    iVar21 = this->kernel_h;
    iVar28 = this->dilation_w * iVar25;
    iVar18 = this->dilation_d;
    iVar26 = iVar20 * iVar21;
    iVar29 = 0;
    iVar31 = 0;
    for (iVar27 = 0; iVar27 < this->kernel_d; iVar27 = iVar27 + 1) {
      for (iVar33 = 0; iVar33 < iVar21; iVar33 = iVar33 + 1) {
        for (lVar32 = 0; (int)lVar32 < iVar25; lVar32 = lVar32 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar31 + lVar32] = iVar29;
          iVar29 = iVar29 + this->dilation_w;
          iVar25 = this->kernel_w;
        }
        iVar31 = iVar31 + (int)lVar32;
        iVar29 = iVar29 + (iVar20 * iVar4 - iVar28);
        iVar21 = this->kernel_h;
      }
      iVar29 = iVar29 + (iVar10 * iVar18 - iVar26) * iVar4;
    }
    Mat::create(top_blob,iVar22,iVar8 + 1,iVar3 + 1,this->num_output,_elemsize,opt->blob_allocator);
    local_210 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar20 = this->group;
      if (iVar20 == this->num_output && iVar30 == iVar20) {
        local_210 = 0;
        uVar23 = 0;
        if (0 < (int)uVar11) {
          uVar23 = (ulong)uVar11;
        }
        local_220 = 0;
        for (lVar32 = 0; lVar32 < iVar30; lVar32 = lVar32 + 1) {
          Mat::channel(&m,top_blob,(int)lVar32);
          local_250 = m.data;
          Mat::~Mat(&m);
          pvVar5 = (this->weight_data).data;
          Mat::channel(&m,&bottom_blob_bordered,(int)lVar32);
          for (iVar30 = 0; iVar30 <= iVar3; iVar30 = iVar30 + 1) {
            for (iVar20 = 0; iVar20 <= iVar8; iVar20 = iVar20 + 1) {
              lVar19 = 0;
              while( true ) {
                if (iVar7 < lVar19) break;
                if (this->bias_term == 0) {
                  fVar36 = 0.0;
                }
                else {
                  fVar36 = *(float *)((long)(this->bias_data).data + lVar32 * 4);
                }
                Mat::depth(&local_170,&m,this->stride_d * iVar30);
                pvVar9 = local_170.data;
                lVar13 = (long)local_170.w * (long)iVar20 * (long)this->stride_h *
                         local_170.elemsize;
                iVar25 = this->stride_w;
                local_268 = (int)lVar19;
                Mat::~Mat(&local_170);
                for (uVar14 = 0; uVar23 != uVar14; uVar14 = uVar14 + 1) {
                  fVar36 = fVar36 + *(float *)((long)pvVar5 + uVar14 * 4 + local_220) *
                                    *(float *)((long)pvVar9 +
                                              (long)_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar14]
                                              * 4 + (long)local_268 * (long)iVar25 * 4 + lVar13);
                }
                fVar34 = fVar36;
                switch(this->activation_type) {
                case 1:
                  if (fVar36 <= 0.0) {
                    fVar34 = 0.0;
                  }
                  break;
                case 2:
                  fVar34 = (float)(~-(uint)(0.0 < fVar36) & *(this->activation_params).data |
                                  -(uint)(0.0 < fVar36) & 0x3f800000) * fVar36;
                  break;
                case 3:
                  pfVar6 = (float *)(this->activation_params).data;
                  fVar34 = *pfVar6;
                  if (fVar36 <= fVar34) {
                    fVar36 = fVar34;
                  }
                  fVar1 = pfVar6[1];
                  fVar34 = fVar36;
                  if (fVar1 <= fVar36) {
                    fVar34 = fVar1;
                  }
                  break;
                case 4:
                  fVar36 = expf(-fVar36);
                  fVar34 = 1.0 / (fVar36 + 1.0);
                  break;
                case 5:
                  fVar34 = expf(fVar36);
                  fVar34 = logf(fVar34 + 1.0);
                  fVar34 = tanhf(fVar34);
                  fVar34 = fVar34 * fVar36;
                  break;
                case 6:
                  pfVar6 = (float *)(this->activation_params).data;
                  fVar1 = *pfVar6;
                  fVar2 = pfVar6[1];
                  fVar35 = -fVar2 / fVar1;
                  fVar34 = 0.0;
                  if ((fVar35 <= fVar36) && (fVar34 = fVar36, fVar36 <= fVar35 + 1.0 / fVar1)) {
                    fVar34 = (fVar1 * fVar36 + fVar2) * fVar36;
                  }
                }
                *(float *)((long)local_250 + lVar19 * 4) = fVar34;
                lVar19 = lVar19 + 1;
              }
              local_250 = (void *)((long)local_250 + (long)iVar22 * 4);
            }
          }
          Mat::~Mat(&m);
          iVar30 = this->group;
          local_220 = local_220 + __n * 4;
        }
      }
      else {
        iVar30 = iVar30 / iVar20;
        uVar12 = this->num_output / iVar20;
        local_210 = 0;
        uVar23 = 0;
        if (0 < (int)uVar11) {
          uVar23 = (ulong)uVar11;
        }
        iVar25 = 0;
        if (0 < iVar30) {
          iVar25 = iVar30;
        }
        uVar14 = 0;
        if (0 < (int)uVar12) {
          uVar14 = (ulong)uVar12;
        }
        local_244 = 0;
        for (lVar32 = 0; lVar32 < iVar20; lVar32 = lVar32 + 1) {
          local_200 = (long)local_244 << 2;
          for (uVar17 = 0; uVar17 != uVar14; uVar17 = uVar17 + 1) {
            lVar19 = uVar17 + lVar32 * (int)uVar12;
            Mat::channel(&m,top_blob,(int)lVar19);
            local_1f0 = m.data;
            Mat::~Mat(&m);
            pvVar5 = (this->weight_data).data;
            for (iVar20 = 0; iVar20 <= iVar3; iVar20 = iVar20 + 1) {
              for (iVar21 = 0; iVar21 <= iVar8; iVar21 = iVar21 + 1) {
                for (lVar13 = 0; lVar13 <= iVar7; lVar13 = lVar13 + 1) {
                  if (this->bias_term == 0) {
                    fVar36 = 0.0;
                  }
                  else {
                    fVar36 = *(float *)((long)(this->bias_data).data + lVar19 * 4);
                  }
                  lVar24 = (long)pvVar5 + local_200;
                  for (iVar18 = 0; iVar18 != iVar25; iVar18 = iVar18 + 1) {
                    Mat::channel(&m,&bottom_blob_bordered,iVar18 + iVar30 * (int)lVar32);
                    Mat::depth(&local_170,&m,this->stride_d * iVar20);
                    pvVar9 = local_170.data;
                    lVar15 = (long)local_170.w * (long)iVar21 * (long)this->stride_h *
                             local_170.elemsize;
                    iVar4 = this->stride_w;
                    Mat::~Mat(&local_170);
                    for (uVar16 = 0; uVar23 != uVar16; uVar16 = uVar16 + 1) {
                      fVar36 = fVar36 + *(float *)(lVar24 + uVar16 * 4) *
                                        *(float *)((long)pvVar9 +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar16] *
                                                  4 + (long)iVar4 * (long)(int)lVar13 * 4 + lVar15);
                    }
                    Mat::~Mat(&m);
                    lVar24 = lVar24 + __n * 4;
                  }
                  fVar34 = fVar36;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar36 <= 0.0) {
                      fVar34 = 0.0;
                    }
                    break;
                  case 2:
                    fVar34 = (float)(~-(uint)(0.0 < fVar36) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar36) & 0x3f800000) * fVar36;
                    break;
                  case 3:
                    pfVar6 = (float *)(this->activation_params).data;
                    fVar34 = *pfVar6;
                    if (fVar36 <= fVar34) {
                      fVar36 = fVar34;
                    }
                    fVar1 = pfVar6[1];
                    fVar34 = fVar36;
                    if (fVar1 <= fVar36) {
                      fVar34 = fVar1;
                    }
                    break;
                  case 4:
                    fVar36 = expf(-fVar36);
                    fVar34 = 1.0 / (fVar36 + 1.0);
                    break;
                  case 5:
                    fVar34 = expf(fVar36);
                    fVar34 = logf(fVar34 + 1.0);
                    fVar34 = tanhf(fVar34);
                    fVar34 = fVar34 * fVar36;
                    break;
                  case 6:
                    pfVar6 = (float *)(this->activation_params).data;
                    fVar1 = *pfVar6;
                    fVar2 = pfVar6[1];
                    fVar35 = -fVar2 / fVar1;
                    fVar34 = 0.0;
                    if ((fVar35 <= fVar36) && (fVar34 = fVar36, fVar36 <= fVar35 + 1.0 / fVar1)) {
                      fVar34 = (fVar1 * fVar36 + fVar2) * fVar36;
                    }
                  }
                  *(float *)((long)local_1f0 + lVar13 * 4) = fVar34;
                }
                local_1f0 = (void *)((long)local_1f0 + (long)iVar22 * 4);
              }
            }
            local_200 = local_200 + (long)(int)(iVar30 * uVar11) * 4;
          }
          iVar20 = this->group;
          local_244 = local_244 + uVar12 * iVar30 * uVar11;
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&bottom_blob_bordered);
  return local_210;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;
#endif

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}